

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

int ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  ushort uVar1;
  ushort uVar2;
  seqDef *psVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  BYTE BVar7;
  uint uVar8;
  uint uVar9;
  ZSTD_longLengthType_e ZVar10;
  ulong uVar11;
  ulong uVar12;
  
  psVar3 = seqStorePtr->sequencesStart;
  uVar11 = (ulong)((long)seqStorePtr->sequences - (long)psVar3) >> 3;
  if ((uVar11 & 0xffffffff) <= seqStorePtr->maxNbSeq) {
    pBVar4 = seqStorePtr->llCode;
    pBVar5 = seqStorePtr->ofCode;
    pBVar6 = seqStorePtr->mlCode;
    for (uVar12 = 0; (uVar11 & 0xffffffff) != uVar12; uVar12 = uVar12 + 1) {
      uVar1 = psVar3[uVar12].litLength;
      uVar8 = ZSTD_highbit32(psVar3[uVar12].offBase);
      uVar2 = psVar3[uVar12].mlBase;
      if (uVar1 < 0x40) {
        BVar7 = ZSTD_LLcode_LL_Code[(uint)uVar1];
      }
      else {
        uVar9 = ZSTD_highbit32((uint)uVar1);
        BVar7 = (char)uVar9 + '\x13';
      }
      pBVar4[uVar12] = BVar7;
      pBVar5[uVar12] = (BYTE)uVar8;
      if (uVar2 < 0x80) {
        BVar7 = ZSTD_MLcode_ML_Code[(uint)uVar2];
      }
      else {
        uVar8 = ZSTD_highbit32((uint)uVar2);
        BVar7 = (char)uVar8 + '$';
      }
      pBVar6[uVar12] = BVar7;
    }
    ZVar10 = seqStorePtr->longLengthType;
    if (ZVar10 == ZSTD_llt_literalLength) {
      pBVar4[seqStorePtr->longLengthPos] = '#';
      ZVar10 = seqStorePtr->longLengthType;
    }
    if (ZVar10 == ZSTD_llt_matchLength) {
      pBVar6[seqStorePtr->longLengthPos] = '4';
    }
    return 0;
  }
  __assert_fail("nbSeq <= seqStorePtr->maxNbSeq",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0xa55,"int ZSTD_seqToCodes(const seqStore_t *)");
}

Assistant:

int ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    int longOffsets = 0;
    assert(nbSeq <= seqStorePtr->maxNbSeq);
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const ofCode = ZSTD_highbit32(sequences[u].offBase);
        U32 const mlv = sequences[u].mlBase;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ofCode;
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
        assert(!(MEM_64bits() && ofCode >= STREAM_ACCUMULATOR_MIN));
        if (MEM_32bits() && ofCode >= STREAM_ACCUMULATOR_MIN)
            longOffsets = 1;
    }
    if (seqStorePtr->longLengthType==ZSTD_llt_literalLength)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthType==ZSTD_llt_matchLength)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
    return longOffsets;
}